

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bingo.hpp
# Opt level: O2

void __thiscall BingoGenerator::init_lifestock_goals(BingoGenerator *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  int i;
  uint __val;
  int __val_00;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->_lifestock_goals;
  for (__val = 0x1e; __val < 0x47; __val = __val + 10) {
    std::__cxx11::to_string(&local_90,__val);
    std::operator+(&local_70,"Reach ",&local_90);
    std::operator+(&local_50,&local_70," total life");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  for (__val_00 = 2; __val_00 != 7; __val_00 = __val_00 + 1) {
    std::__cxx11::to_string(&local_90,__val_00);
    std::operator+(&local_70,"Buy ",&local_90);
    std::operator+(&local_50,&local_70," Life Stock in shops");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  vectools::shuffle<std::__cxx11::string>(this_00,&this->_rng);
  return;
}

Assistant:

void init_lifestock_goals()
    {
        for(int i = 30 ; i <= 70 ; i += 10)
            _lifestock_goals.emplace_back("Reach " + std::to_string(i) + " total life");
        for(int i = 2 ; i <= 6 ; ++i)
            _lifestock_goals.emplace_back("Buy " + std::to_string(i) + " Life Stock in shops");
        vectools::shuffle(_lifestock_goals, _rng);
    }